

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
fasttext::Dictionary::getCounts(Dictionary *this,entry_type type)

{
  bool bVar1;
  reference peVar2;
  entry_type in_DL;
  vector<long,_std::allocator<long>_> *in_RSI;
  vector<long,_std::allocator<long>_> *in_RDI;
  entry *w;
  const_iterator __end1;
  const_iterator __begin1;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *__range1;
  vector<long,_std::allocator<long>_> *counts;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_stack_ffffffffffffff98;
  vector<long,_std::allocator<long>_> *__x;
  __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  local_28;
  pointer *local_20;
  undefined1 local_12;
  entry_type local_11;
  
  local_12 = 0;
  __x = in_RDI;
  local_11 = in_DL;
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x1a8d25);
  local_20 = &in_RSI[1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_28._M_current =
       (entry *)std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin
                          (in_stack_ffffffffffffff98);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffff98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                             *)in_stack_ffffffffffffff98), bVar1) {
    peVar2 = __gnu_cxx::
             __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator*(&local_28);
    if (peVar2->type == local_11) {
      std::vector<long,_std::allocator<long>_>::push_back(in_RSI,(value_type_conflict3 *)__x);
    }
    __gnu_cxx::
    __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator++(&local_28);
  }
  return __x;
}

Assistant:

std::vector<int64_t> Dictionary::getCounts(entry_type type) const {
  std::vector<int64_t> counts;
  for (auto& w : words_) {
    if (w.type == type) {
      counts.push_back(w.count);
    }
  }
  return counts;
}